

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-fns.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  ggml_type_traits_cpu *pgVar5;
  long *plVar6;
  float *test_data_00;
  long in_RSI;
  int in_EDI;
  float fVar7;
  float max_allowed_error;
  float vec_dot_error;
  float reference_error;
  float max_quantization_error;
  float total_error;
  ggml_type ei;
  ggml_type_traits_cpu *qfns_cpu;
  ggml_type_traits *qfns;
  ggml_type type;
  int i_1;
  bool failed;
  int num_failed;
  vector<float,_std::allocator<float>_> test_data2;
  vector<float,_std::allocator<float>_> test_data;
  int i;
  string arg;
  size_t test_size;
  bool verbose;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined3 uVar8;
  undefined4 in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  size_type in_stack_fffffffffffffe58;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe60;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  long *test_size_00;
  ggml_type_traits_cpu *qfns_cpu_00;
  ggml_type_traits *qfns_00;
  float *test_data2_00;
  float *test_data1;
  size_t in_stack_ffffffffffffff20;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  int iVar9;
  int local_a0;
  uint local_98;
  undefined1 local_91 [32];
  undefined1 local_71 [25];
  undefined4 local_58;
  int local_44;
  string local_40 [32];
  undefined8 local_20;
  byte local_11;
  long local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_11 = 0;
  local_20 = 0x1000;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_40);
  local_44 = 1;
  do {
    if (local_8 <= local_44) {
      test_data1 = (float *)local_71;
      std::allocator<float>::allocator((allocator<float> *)0x103421);
      std::vector<float,_std::allocator<float>_>::vector
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      std::allocator<float>::~allocator((allocator<float> *)0x10344a);
      test_data2_00 = (float *)local_91;
      std::allocator<float>::allocator((allocator<float> *)0x10345f);
      std::vector<float,_std::allocator<float>_>::vector
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      std::allocator<float>::~allocator((allocator<float> *)0x103488);
      std::vector<float,_std::allocator<float>_>::size
                ((vector<float,_std::allocator<float>_> *)(local_71 + 1));
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x1034b2);
      generate_data(in_stack_fffffffffffffe54,
                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                    (float *)in_stack_fffffffffffffe40);
      qfns_00 = (ggml_type_traits *)(local_91 + 1);
      std::vector<float,_std::allocator<float>_>::size
                ((vector<float,_std::allocator<float>_> *)qfns_00);
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x1034f1);
      generate_data(in_stack_fffffffffffffe54,
                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                    (float *)in_stack_fffffffffffffe40);
      ggml_cpu_init();
      local_98 = 0;
      for (local_a0 = 0; local_a0 < 0x27; local_a0 = local_a0 + 1) {
        pgVar5 = (ggml_type_traits_cpu *)ggml_get_type_traits(local_a0);
        qfns_cpu_00 = pgVar5;
        plVar6 = (long *)ggml_get_type_traits_cpu(local_a0);
        if (pgVar5->vec_dot != (ggml_vec_dot_t)0x0) {
          test_size_00 = plVar6;
          iVar9 = local_a0;
          test_data_00 = (float *)ggml_type_name(local_a0);
          printf("Testing %s\n",test_data_00);
          ggml_quantize_init(iVar9);
          if ((*plVar6 != 0) && (pgVar5[1].vec_dot != (ggml_vec_dot_t)0x0)) {
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x1036ba);
            fVar7 = total_quantization_error(qfns_00,qfns_cpu_00,(size_t)test_size_00,test_data_00);
            if (local_a0 == 0x22) {
              local_144 = 0.01;
            }
            else {
              if (local_a0 == 0x23) {
                local_148 = 0.01;
              }
              else {
                if (local_a0 == 10) {
                  local_14c = 0.0075;
                }
                else {
                  if (local_a0 == 0x16) {
                    local_150 = 0.0075;
                  }
                  else {
                    if (local_a0 == 0xb) {
                      local_154 = 0.004;
                    }
                    else {
                      if (local_a0 == 0x15) {
                        local_158 = 0.004;
                      }
                      else {
                        local_15c = 0.005;
                        if (local_a0 != 0x12) {
                          local_15c = 0.002;
                        }
                        local_158 = local_15c;
                      }
                      local_154 = local_158;
                    }
                    local_150 = local_154;
                  }
                  local_14c = local_150;
                }
                local_148 = local_14c;
              }
              local_144 = local_148;
            }
            bVar1 = (fVar7 < local_144 ^ 0xffU) & 1;
            if ((bVar1 != 0) || ((local_11 & 1) != 0)) {
              uVar4 = ggml_type_name(local_a0);
              printf("%5s absolute quantization error:    %s (%f)\n",(double)fVar7,uVar4,
                     RESULT_STR[bVar1]);
            }
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x103900);
            in_stack_ffffffffffffff38 =
                 reference_quantization_error
                           ((ggml_type_traits *)CONCAT44(iVar9,fVar7),
                            (ggml_type_traits_cpu *)CONCAT44(local_144,in_stack_ffffffffffffff38),
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (float *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
            bVar2 = (in_stack_ffffffffffffff38 < 0.0001 ^ 0xffU) & 1;
            if ((bVar2 != 0) || ((local_11 & 1) != 0)) {
              uVar4 = ggml_type_name(local_a0);
              printf("%5s reference implementation error: %s (%f)\n",
                     (double)in_stack_ffffffffffffff38,uVar4,RESULT_STR[bVar2]);
            }
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x1039f0);
            std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)0x103a02);
            in_stack_ffffffffffffff34 =
                 dot_product_error((ggml_type_traits *)
                                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                   (ggml_type_traits_cpu *)
                                   CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                                   in_stack_ffffffffffffff20,test_data1,test_data2_00);
            if (((((local_a0 == 10) || (local_a0 == 0x11)) || (local_a0 == 0x10)) ||
                ((local_a0 == 0x12 || (local_a0 == 0x15)))) || (local_a0 == 0x16)) {
              in_stack_fffffffffffffe54 = 0.04;
            }
            else {
              uVar8 = (undefined3)in_stack_fffffffffffffe50;
              in_stack_fffffffffffffe50 = CONCAT13(1,uVar8);
              if (local_a0 != 0x22) {
                in_stack_fffffffffffffe50 = CONCAT13(local_a0 == 0x23,uVar8);
              }
              in_stack_fffffffffffffe54 = 0.15;
              if ((char)((uint)in_stack_fffffffffffffe50 >> 0x18) == '\0') {
                in_stack_fffffffffffffe54 = 0.02;
              }
            }
            bVar3 = (in_stack_ffffffffffffff34 < in_stack_fffffffffffffe54 ^ 0xffU) & 1;
            local_98 = (uint)bVar3 + (uint)bVar2 + bVar1 + local_98;
            in_stack_ffffffffffffff30 = in_stack_fffffffffffffe54;
            if ((bVar3 != 0) || ((local_11 & 1) != 0)) {
              uVar4 = ggml_type_name(local_a0);
              printf("%5s dot product error:              %s (%f)\n",
                     (double)in_stack_ffffffffffffff34,uVar4,RESULT_STR[bVar3]);
            }
          }
        }
      }
      if ((local_98 != 0) || ((local_11 & 1) != 0)) {
        printf("%d tests failed\n",(ulong)local_98);
      }
      local_4 = (uint)(0 < (int)local_98);
      local_58 = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
LAB_00103c1f:
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
    std::__cxx11::string::operator=(local_40,*(char **)(local_10 + (long)local_44 * 8));
    in_stack_ffffffffffffff2f = std::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
    ;
    if (!(bool)in_stack_ffffffffffffff2f) {
      __stream = _stderr;
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,"error: unknown argument: %s\n",uVar4);
      local_4 = 1;
      local_58 = 1;
      goto LAB_00103c1f;
    }
    local_11 = 1;
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    bool verbose = false;
    const size_t test_size = 32 * 128;

    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "-v") {
            verbose = true;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }

    std::vector<float> test_data(test_size);
    std::vector<float> test_data2(test_size);

    generate_data(0.0, test_data.size(), test_data.data());
    generate_data(1.0, test_data2.size(), test_data2.data());

    ggml_cpu_init();

    int num_failed = 0;
    bool failed = false;

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);

        // deprecated - skip
        if (qfns->blck_size == 0) {
            continue;
        }

        const ggml_type ei = (ggml_type)i;

        printf("Testing %s\n", ggml_type_name((ggml_type) i));
        ggml_quantize_init(ei);

        if (qfns_cpu->from_float && qfns->to_float) {
            const float total_error = total_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            const float max_quantization_error =
                type == GGML_TYPE_TQ1_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_TQ2_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_Q2_K    ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_IQ2_S   ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_Q3_K    ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_S   ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_XXS ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS_XXS : MAX_QUANTIZATION_TOTAL_ERROR;
            failed = !(total_error < max_quantization_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s absolute quantization error:    %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], total_error);
            }

            const float reference_error = reference_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            failed = !(reference_error < MAX_QUANTIZATION_REFERENCE_ERROR);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s reference implementation error: %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], reference_error);
            }

            const float vec_dot_error = dot_product_error(qfns, qfns_cpu, test_size, test_data.data(), test_data2.data());
            const float max_allowed_error = type == GGML_TYPE_Q2_K || type == GGML_TYPE_IQ2_XS || type == GGML_TYPE_IQ2_XXS ||
                                            type == GGML_TYPE_IQ3_XXS || type == GGML_TYPE_IQ3_S || type == GGML_TYPE_IQ2_S
                                          ? MAX_DOT_PRODUCT_ERROR_LOWBIT
                                          : type == GGML_TYPE_TQ1_0 || type == GGML_TYPE_TQ2_0
                                          ? MAX_DOT_PRODUCT_ERROR_TERNARY
                                          : MAX_DOT_PRODUCT_ERROR;
            failed = !(vec_dot_error < max_allowed_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s dot product error:              %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], vec_dot_error);
            }
        }
    }

    if (num_failed || verbose) {
        printf("%d tests failed\n", num_failed);
    }

    return num_failed > 0;
}